

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  buffer<char> *buf;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  string_view message_00;
  char *system_message;
  undefined1 *local_270;
  char *local_268;
  undefined1 **local_260;
  undefined1 *local_258;
  undefined **local_248;
  undefined1 *local_240;
  undefined1 *puStack_238;
  undefined1 *local_230;
  undefined1 local_228 [504];
  
  message_00.data_ = (undefined1 **)message.size_;
  local_240 = local_228;
  local_248 = &PTR_grow_007fca68;
  local_230 = (undefined1 *)0x1f4;
  puStack_238 = (undefined1 *)0x1f4;
  do {
    local_270 = local_240;
    if ((local_240 == (undefined1 *)0x0) || (puStack_238 == (undefined1 *)0x0)) {
      detail::assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                          ,0x47,"invalid buffer");
    }
    local_268 = (char *)CONCAT44(local_268._4_4_,error_code);
    local_258 = puStack_238;
    local_260 = &local_270;
    iVar3 = detail::anon_func::dispatcher::run((dispatcher *)&local_268);
    if (iVar3 == 0x22) {
      puVar1 = (undefined1 *)((long)puStack_238 * 2);
      if (local_230 < puVar1) {
        (*(code *)*local_248)(&local_248,puVar1);
      }
      puStack_238 = puVar1;
      if (local_230 < puVar1) {
        puStack_238 = local_230;
      }
      iVar3 = 0;
      bVar2 = true;
    }
    else {
      if (iVar3 == 0) {
        local_258 = local_270;
        format_str.size_ = 6;
        format_str.data_ = "{}: {}";
        args.field_1.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_268;
        args.desc_ = 0xcd;
        in_R8.values_ =
             (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
             &local_268;
        local_268 = message.data_;
        local_260 = message_00.data_;
        detail::vformat_to<char>(out,format_str,args,(locale_ref)0x0);
        iVar3 = 1;
      }
      else {
        iVar3 = 2;
      }
      bVar2 = false;
    }
  } while (iVar3 == 0);
  if (iVar3 == 2) {
    bVar2 = true;
  }
  if (local_240 != local_228) {
    operator_delete(local_240,(ulong)local_230);
  }
  if (bVar2) {
    message_00.size_ = (size_t)in_R8.values_;
    detail::format_error_code
              ((detail *)out,(buffer<char> *)(ulong)(uint)error_code,(int)message.data_,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }